

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O3

int pkey_ctrl_gost(EVP_PKEY *pkey,int op,long arg1,void *arg2)

{
  int iVar1;
  uint n;
  int iVar2;
  EVP_PKEY_CTX *ctx;
  char *name;
  EVP_CIPHER *cipher;
  void *pvVar3;
  EVP_PKEY *peer;
  ASN1_STRING *pval;
  ASN1_OBJECT *pAVar4;
  EVP_CIPHER_CTX *pEVar5;
  uchar *penc;
  int iVar6;
  X509_ALGOR *pXVar7;
  X509_PUBKEY *pub;
  X509_ALGOR *alg1;
  ASN1_BIT_STRING *pubkey;
  X509_ALGOR *pubalg;
  ASN1_OCTET_STRING *ukm;
  int ptype;
  X509_ALGOR *alg2;
  X509_ALGOR *alg;
  size_t shared_key_size;
  uchar shared_key [64];
  X509_ALGOR *local_d0;
  ASN1_STRING *local_c8;
  X509_ALGOR *local_c0;
  ASN1_STRING *local_b8;
  int local_ac;
  X509_ALGOR *local_a8;
  void *local_a0;
  undefined8 *local_98;
  void *local_90;
  ASN1_OBJECT *local_88;
  size_t local_80;
  ASN1_OBJECT *local_78 [9];
  
  iVar1 = EVP_PKEY_get_base_id();
  local_d0 = (X509_ALGOR *)0x0;
  local_a8 = (X509_ALGOR *)0x0;
  if ((iVar1 - 0x32bU < 7) && ((0x43U >> (iVar1 - 0x32bU & 0x1f) & 1) != 0)) {
    iVar2 = 0x329;
  }
  else if (iVar1 == 0x3d4) {
    iVar2 = 0x3d7;
  }
  else {
    if (iVar1 != 0x3d3) {
      return -1;
    }
    iVar2 = 0x3d6;
  }
  iVar6 = -2;
  switch(op) {
  case 1:
    if (arg1 != 0) {
      return 1;
    }
    PKCS7_SIGNER_INFO_get0_algs((PKCS7_SIGNER_INFO *)arg2,(EVP_PKEY **)0x0,&local_d0,&local_a8);
    goto LAB_0010f7d6;
  case 2:
    if (arg1 != 0) {
      return 1;
    }
    pval = encode_gost_algor_params(pkey);
    if (pval == (ASN1_STRING *)0x0) {
      return -1;
    }
    PKCS7_RECIP_INFO_get0_alg((PKCS7_RECIP_INFO *)arg2,&local_d0);
    pXVar7 = local_d0;
    iVar1 = EVP_PKEY_get_id(pkey);
    pAVar4 = OBJ_nid2obj(iVar1);
    goto LAB_0010face;
  case 3:
    *(int *)arg2 = iVar2;
    return 2;
  default:
    goto switchD_0010f6f0_caseD_4;
  case 5:
    if (arg1 != 0) {
      return 1;
    }
    CMS_SignerInfo_get0_algs
              ((CMS_SignerInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,&local_d0,&local_a8);
LAB_0010f7d6:
    pXVar7 = local_d0;
    pAVar4 = OBJ_nid2obj(iVar2);
    X509_ALGOR_set0(pXVar7,pAVar4,5,(void *)0x0);
    pXVar7 = local_a8;
    pAVar4 = OBJ_nid2obj(iVar1);
    X509_ALGOR_set0(pXVar7,pAVar4,5,(void *)0x0);
    return 1;
  case 7:
    ctx = (EVP_PKEY_CTX *)CMS_RecipientInfo_get0_pkey_ctx(arg2);
    if (arg1 != 0) {
      if (ctx == (EVP_PKEY_CTX *)0x0) {
        return 0;
      }
      iVar1 = CMS_RecipientInfo_type((CMS_RecipientInfo *)arg2);
      if (iVar1 == 0) {
        pvVar3 = EVP_PKEY_CTX_get_data(ctx);
        CMS_RecipientInfo_ktri_get0_algs
                  ((CMS_RecipientInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,(X509_ALGOR **)local_78);
        iVar1 = OBJ_obj2nid((ASN1_OBJECT *)local_78[0]->sn);
        if (iVar1 < 0x3d3) {
          if ((iVar1 != 0x32b) && (iVar1 != 0x331)) {
LAB_0010fafc:
            ERR_GOST_error(0x9d,0x89,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                           ,0x164);
            return 0;
          }
        }
        else if (1 < iVar1 - 0x3d3U) {
          if (iVar1 == 0x49d) {
            *(undefined4 *)((long)pvVar3 + 0x3c) = 0x4a4;
          }
          else {
            if (iVar1 != 0x49f) goto LAB_0010fafc;
            *(undefined4 *)((long)pvVar3 + 0x3c) = 0x3f5;
          }
          break;
        }
        *(undefined4 *)((long)pvVar3 + 0x3c) = 0x32d;
        break;
      }
      if (iVar1 != 1) {
        ERR_GOST_error(0x9b,0x89,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,0x176);
        return 0;
      }
      peer = (EVP_PKEY *)0x0;
      local_c0 = (X509_ALGOR *)0x0;
      local_c8 = (ASN1_STRING *)0x0;
      local_80 = 0x40;
      iVar1 = CMS_RecipientInfo_kari_get0_alg(arg2,&local_98,&local_b8);
      pub = (X509_PUBKEY *)0x0;
      if (iVar1 != 0) {
        peer = (EVP_PKEY *)0x0;
        iVar1 = CMS_RecipientInfo_kari_get0_orig_id(arg2,&local_c0,&local_c8,0,0,0);
        pub = (X509_PUBKEY *)0x0;
        if (iVar1 != 0) {
          n = OBJ_obj2nid((ASN1_OBJECT *)*local_98);
          if (*(int *)local_98[1] == 0x10) {
            if ((n | 2) == 0x49f) {
              name = OBJ_nid2sn(n);
              cipher = EVP_get_cipherbyname(name);
              if (cipher != (EVP_CIPHER *)0x0) {
                iVar1 = ASN1_STRING_length(local_b8);
                pvVar3 = (void *)ASN1_STRING_get0_data(local_b8);
                iVar1 = EVP_PKEY_CTX_ctrl(ctx,-1,-1,8,iVar1,pvVar3);
                if (iVar1 < 1) goto LAB_0010fb3d;
                peer = (EVP_PKEY *)0x0;
                if (local_c8 == (ASN1_STRING *)0x0) {
                  pub = (X509_PUBKEY *)0x0;
LAB_0010fb6c:
                  iVar1 = EVP_PKEY_derive(ctx,(uchar *)local_78,&local_80);
                  if (0 < iVar1) {
                    pEVar5 = (EVP_CIPHER_CTX *)CMS_RecipientInfo_kari_get0_ctx(arg2);
                    EVP_CIPHER_CTX_set_flags(pEVar5,1);
                    pEVar5 = (EVP_CIPHER_CTX *)CMS_RecipientInfo_kari_get0_ctx(arg2);
                    iVar1 = EVP_DecryptInit_ex(pEVar5,cipher,(ENGINE *)0x0,(uchar *)local_78,
                                               local_b8->data + 0x18);
                    EVP_PKEY_free(peer);
                    if (iVar1 != 0) {
                      return 1;
                    }
                    goto LAB_0010fb4b;
                  }
                  iVar2 = 0x69;
                  iVar1 = 0x139;
                }
                else {
                  pub = (X509_PUBKEY *)0x0;
                  if (local_c0 == (X509_ALGOR *)0x0) goto LAB_0010fb6c;
                  local_78[0] = (ASN1_OBJECT *)0x0;
                  local_ac = 0;
                  local_a0 = (void *)0x0;
                  peer = EVP_PKEY_new();
                  pub = X509_PUBKEY_new();
                  if (pub == (X509_PUBKEY *)0x0 || peer == (EVP_PKEY *)0x0) {
                    iVar2 = 0xc0100;
                    iVar1 = 0x11f;
                  }
                  else {
                    X509_ALGOR_get0(local_78,&local_ac,&local_a0,local_c0);
                    iVar1 = local_ac;
                    local_88 = local_78[0];
                    local_90 = local_a0;
                    penc = (uchar *)ASN1_STRING_get0_data(local_c8);
                    iVar2 = ASN1_STRING_length(local_c8);
                    iVar1 = X509_PUBKEY_set0_param(pub,local_88,iVar1,local_90,penc,iVar2);
                    if (iVar1 == 0) {
                      iVar2 = 0x7d;
                      iVar1 = 0x129;
                    }
                    else {
                      iVar1 = pub_decode_gost_ec((EVP_PKEY *)peer,(X509_PUBKEY *)pub);
                      if (iVar1 < 1) {
                        iVar2 = 0x8a;
                        iVar1 = 0x12e;
                      }
                      else {
                        iVar1 = EVP_PKEY_derive_set_peer(ctx,peer);
                        if (0 < iVar1) goto LAB_0010fb6c;
                        iVar2 = 0x8b;
                        iVar1 = 0x133;
                      }
                    }
                  }
                }
                ERR_GOST_error(0x9c,iVar2,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                               ,iVar1);
                goto LAB_0010fb43;
              }
            }
            ERR_GOST_error(0x9c,0x67,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                           ,0x10e);
          }
LAB_0010fb3d:
          peer = (EVP_PKEY *)0x0;
          pub = (X509_PUBKEY *)0x0;
        }
      }
LAB_0010fb43:
      EVP_PKEY_free(peer);
LAB_0010fb4b:
      X509_PUBKEY_free(pub);
      return 0;
    }
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      return 0;
    }
    pvVar3 = EVP_PKEY_CTX_get_data(ctx);
    iVar2 = *(int *)((long)pvVar3 + 0x3c);
    if ((iVar2 == 0x4a4) || (iVar2 == 0x3f5)) {
      iVar1 = (uint)(iVar2 != 0x4a4) * 2 + 0x49d;
      iVar2 = EVP_PKEY_get_base_id(pkey);
      pval = gost_encode_cms_params(iVar2 == 0x3d3 ^ 0x3e1);
    }
    else {
      pval = encode_gost_algor_params(pkey);
    }
    if (pval == (ASN1_STRING *)0x0) {
      return -1;
    }
    CMS_RecipientInfo_ktri_get0_algs
              ((CMS_RecipientInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,&local_d0);
    pXVar7 = local_d0;
    pAVar4 = OBJ_nid2obj(iVar1);
LAB_0010face:
    X509_ALGOR_set0(pXVar7,pAVar4,0x10,pval);
    break;
  case 8:
    *(undefined4 *)arg2 = 0;
    break;
  case 0xb:
    if (1 < (ulong)arg1) {
      return 0;
    }
    *(undefined4 *)arg2 = 1;
  }
  iVar6 = 1;
switchD_0010f6f0_caseD_4:
  return iVar6;
}

Assistant:

static int pkey_ctrl_gost(EVP_PKEY *pkey, int op, long arg1, void *arg2)
{
    int nid = EVP_PKEY_base_id(pkey), md_nid = NID_undef;
    X509_ALGOR *alg1 = NULL, *alg2 = NULL;

    switch (nid) {
    case NID_id_GostR3410_2012_512:
        md_nid = NID_id_GostR3411_2012_512;
        break;
    case NID_id_GostR3410_2012_256:
        md_nid = NID_id_GostR3411_2012_256;
        break;
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_94:
        md_nid = NID_id_GostR3411_94;
        break;
    default:
        return -1;
    }

    switch (op) {
    case ASN1_PKEY_CTRL_PKCS7_SIGN:
        if (arg1 == 0) {
            PKCS7_SIGNER_INFO_get0_algs((PKCS7_SIGNER_INFO *)arg2, NULL,
                                        &alg1, &alg2);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(md_nid), V_ASN1_NULL, 0);
            X509_ALGOR_set0(alg2, OBJ_nid2obj(nid), V_ASN1_NULL, 0);
        }
        return 1;
#ifndef OPENSSL_NO_CMS
    case ASN1_PKEY_CTRL_CMS_SIGN:
        if (arg1 == 0) {
            CMS_SignerInfo_get0_algs((CMS_SignerInfo *)arg2, NULL, NULL,
                                     &alg1, &alg2);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(md_nid), V_ASN1_NULL, 0);
            X509_ALGOR_set0(alg2, OBJ_nid2obj(nid), V_ASN1_NULL, 0);
        }
        return 1;
#endif
    case ASN1_PKEY_CTRL_PKCS7_ENCRYPT:
        if (arg1 == 0) { /* Encryption */
            ASN1_STRING *params = encode_gost_algor_params(pkey);
            if (!params) {
                return -1;
            }
            PKCS7_RECIP_INFO_get0_alg((PKCS7_RECIP_INFO *)arg2, &alg1);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(EVP_PKEY_id(pkey)),
                            V_ASN1_SEQUENCE, params);
				}
        return 1;
#ifndef OPENSSL_NO_CMS
    case ASN1_PKEY_CTRL_CMS_ENVELOPE:
        if (arg1 == 0) {
          EVP_PKEY_CTX *pctx;
          CMS_RecipientInfo *ri = arg2;

          struct gost_pmeth_data *gctx = NULL;
          ASN1_STRING *params = NULL;

          pctx = CMS_RecipientInfo_get0_pkey_ctx(ri);
          if (!pctx)
            return 0;

          gctx = EVP_PKEY_CTX_get_data(pctx);

          switch (gctx->cipher_nid) {
            case NID_magma_ctr:
            case NID_kuznyechik_ctr:
              {
                int ka_nid;

                nid = (gctx->cipher_nid == NID_magma_ctr) ? NID_magma_kexp15 :
                  NID_kuznyechik_kexp15;

                ka_nid = (EVP_PKEY_base_id(pkey) == NID_id_GostR3410_2012_256) ?
                  NID_id_tc26_agreement_gost_3410_2012_256 : NID_id_tc26_agreement_gost_3410_2012_512;

                params = gost_encode_cms_params(ka_nid);
              }
              break;
            default:
                params = encode_gost_algor_params(pkey);
              break;
          }

          if (params == NULL)
              return -1;

          CMS_RecipientInfo_ktri_get0_algs((CMS_RecipientInfo *)arg2, NULL,
              NULL, &alg1);
          X509_ALGOR_set0(alg1, OBJ_nid2obj(nid), V_ASN1_SEQUENCE, params);
        } else {
          EVP_PKEY_CTX *pctx;
          CMS_RecipientInfo *ri = arg2;
          pctx = CMS_RecipientInfo_get0_pkey_ctx(ri);
          if (!pctx)
              return 0;
          return gost_cms_set_shared_info(pctx, ri);
        }
        return 1;
#ifdef ASN1_PKEY_CTRL_CMS_RI_TYPE
  case ASN1_PKEY_CTRL_CMS_RI_TYPE:
        *(int *)arg2 = CMS_RECIPINFO_TRANS;
        return 1;
	case ASN1_PKEY_CTRL_CMS_IS_RI_TYPE_SUPPORTED:
			if (arg1 == CMS_RECIPINFO_AGREE || arg1 == CMS_RECIPINFO_TRANS) {
          *(int *)arg2 = 1;
				  return 1;
      }
			else
				  return 0;
			break;
#endif
#endif
    case ASN1_PKEY_CTRL_DEFAULT_MD_NID:
        *(int *)arg2 = md_nid;
        return 2;
    }

    return -2;
}